

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort.cpp
# Opt level: O3

void insert<16000u,vector_brodnik<unsigned_char*>,BurstSimple<unsigned_char>,unsigned_char>
               (TrieNode<unsigned_char> *root,uchar **strings,size_t n)

{
  _WordT *p_Var1;
  byte bVar2;
  TrieNode<unsigned_char> *pTVar3;
  uchar **ppuVar4;
  ulong uVar5;
  TrieNode<unsigned_char> *pTVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  byte *pbVar10;
  vector_brodnik<unsigned_char_*> *this;
  size_t depth;
  BurstSimple<unsigned_char> local_61;
  vector_brodnik<unsigned_char_*> *local_60;
  byte *local_58;
  TrieNode<unsigned_char> *local_50;
  size_t local_48;
  uchar **local_40;
  size_t local_38;
  
  if (n != 0) {
    sVar7 = 0;
    local_50 = root;
    local_48 = n;
    local_40 = strings;
    do {
      pbVar10 = local_40[sVar7];
      if (pbVar10 == (byte *)0x0) {
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x26,"unsigned char get_char(unsigned char *, size_t)");
      }
      bVar2 = *pbVar10;
      uVar9 = (ulong)bVar2;
      uVar8 = (ulong)(bVar2 >> 6);
      depth = 1;
      uVar5 = (local_50->is_trie).super__Base_bitset<4UL>._M_w[uVar8] >> (uVar9 & 0x3f);
      pTVar3 = local_50;
      while (local_38 = sVar7, (uVar5 & 1) != 0) {
        if ((char)uVar9 == '\0') {
          __assert_fail("not is_end(c)",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort.cpp"
                        ,0xdf,
                        "void insert(TrieNode<CharT> *, unsigned char **, size_t) [Threshold = 16000U, BucketT = vector_brodnik<unsigned char *>, BurstImpl = BurstSimple<unsigned char>, CharT = unsigned char]"
                       );
        }
        pTVar3 = (TrieNode<unsigned_char> *)(pTVar3->buckets)._M_elems[uVar9];
        bVar2 = pbVar10[depth];
        uVar9 = (ulong)bVar2;
        uVar8 = (ulong)(bVar2 >> 6);
        depth = depth + 1;
        uVar5 = (pTVar3->is_trie).super__Base_bitset<4UL>._M_w[uVar8] >> (uVar9 & 0x3f);
      }
      this = (vector_brodnik<unsigned_char_*> *)(pTVar3->buckets)._M_elems[uVar9];
      if (this == (vector_brodnik<unsigned_char_*> *)0x0) {
        local_58 = pbVar10;
        local_60 = (vector_brodnik<unsigned_char_*> *)operator_new(0x38);
        (local_60->_index_block).
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (local_60->_index_block).
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_60->_index_block).
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vector_brodnik<unsigned_char_*>::clear(local_60);
        (pTVar3->buckets)._M_elems[uVar9] = local_60;
        pbVar10 = local_58;
        this = local_60;
      }
      sVar7 = this->_left_in_block;
      if (sVar7 == 0) {
        local_60 = this;
        local_58 = pbVar10;
        vector_brodnik<unsigned_char_*>::grow(this);
        sVar7 = local_60->_left_in_block;
        pbVar10 = local_58;
        this = local_60;
      }
      ppuVar4 = this->_insertpos;
      this->_insertpos = ppuVar4 + 1;
      *ppuVar4 = pbVar10;
      this->_left_in_block = sVar7 - 1;
      if ((bVar2 != 0) &&
         (16000 < ((long)(2 << (this->_superblock & 0x1f)) -
                  (sVar7 + (ulong)this->_left_in_superblock * this->_block_size)) - 0x3f)) {
        pTVar6 = BurstSimple<unsigned_char>::operator()(&local_61,this,depth);
        (pTVar3->buckets)._M_elems[uVar9] = pTVar6;
        p_Var1 = (pTVar3->is_trie).super__Base_bitset<4UL>._M_w + uVar8;
        *p_Var1 = *p_Var1 | 1L << (bVar2 & 0x3f);
        vector_brodnik<unsigned_char_*>::~vector_brodnik(this);
        operator_delete(this);
      }
      sVar7 = local_38 + 1;
    } while (sVar7 != local_48);
  }
  return;
}

Assistant:

static inline void
insert(TrieNode<CharT>* root, unsigned char** strings, size_t n)
{
	for (size_t i=0; i < n; ++i) {
		unsigned char* str = strings[i];
		size_t depth = 0;
		CharT c = get_char<CharT>(str, 0);
		TrieNode<CharT>* node = root;
		while (node->is_trie[c]) {
			assert(not is_end(c));
			node = static_cast<TrieNode<CharT>*>(node->buckets[c]);
			depth += sizeof(CharT);
			c = get_char<CharT>(str, depth);
		}
		BucketT* bucket = static_cast<BucketT*>(node->buckets[c]);
		if (not bucket) {
			node->buckets[c] = bucket = new BucketT;
		}
		bucket->push_back(str);
		if (is_end(c)) continue;
		if (bucket->size() > Threshold) {
			node->buckets[c] = BurstImpl()(*bucket,
					depth+sizeof(CharT));
			node->is_trie[c] = true;
			delete bucket;
		}
	}
}